

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

ostream * glcts::operator<<(ostream *stream,var2str *var)

{
  ostream *poVar1;
  
  if (var->m_prefix != (char *)0x0) {
    std::operator<<(stream,var->m_prefix);
  }
  std::operator<<(stream,var->m_name);
  if (var->m_index != (GLchar *)0x0) {
    poVar1 = std::operator<<(stream,"[");
    poVar1 = std::operator<<(poVar1,var->m_index);
    std::operator<<(poVar1,"]");
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const var2str& var)
{
	if (0 != var.m_prefix)
	{
		stream << var.m_prefix;
	}

	stream << var.m_name;

	if (0 != var.m_index)
	{
		stream << "[" << var.m_index << "]";
	}

	return stream;
}